

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O2

Bool FindLinkA(TidyDocImpl *doc,Node *node,ctmbstr url)

{
  TidyDocImpl *doc_00;
  Dict *pDVar1;
  Bool BVar2;
  int iVar3;
  AttVal *av;
  ctmbstr extraout_RDX;
  ctmbstr extraout_RDX_00;
  ctmbstr extraout_RDX_01;
  Node **ppNVar4;
  
  BVar2 = no;
  ppNVar4 = &(doc->root).content;
  while ((BVar2 == no && (doc_00 = (TidyDocImpl *)*ppNVar4, doc_00 != (TidyDocImpl *)0x0))) {
    pDVar1 = (doc_00->root).tag;
    if ((pDVar1 == (Dict *)0x0) || (pDVar1->id != TidyTag_A)) {
      BVar2 = FindLinkA(doc_00,node,url);
      url = extraout_RDX_01;
    }
    else {
      av = prvTidyAttrGetById((Node *)doc_00,TidyAttr_HREF);
      BVar2 = hasValue(av);
      if (BVar2 == no) {
        BVar2 = no;
        url = extraout_RDX;
      }
      else {
        iVar3 = prvTidytmbstrcmp((ctmbstr)node,av->value);
        BVar2 = (Bool)(iVar3 == 0);
        url = extraout_RDX_00;
      }
    }
    ppNVar4 = &(doc_00->root).next;
  }
  return BVar2;
}

Assistant:

static Bool FindLinkA( TidyDocImpl* doc, Node* node, ctmbstr url )
{
  Bool found = no;
  for ( node = node->content; !found && node; node = node->next )
  {
    if ( nodeIsA(node) )
    {
      AttVal* href = attrGetHREF( node );
      found = ( hasValue(href) && urlMatch(url, href->value) );
    }
    else
        found = FindLinkA( doc, node, url );
  }
  return found;
}